

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool __thiscall testing::internal::UnitTestImpl::RunAllTests(UnitTestImpl *this)

{
  InternalRunDeathTestFlag *pIVar1;
  TestEventRepeater *pTVar2;
  pointer ppEVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  TimeInMillis TVar7;
  UnitTestImpl *pUVar8;
  TestSuite *pTVar9;
  TestPartResult *pTVar10;
  uint uVar11;
  int j;
  int i;
  pointer ppEVar12;
  byte bVar13;
  int test_index;
  TestResult *this_00;
  char *local_80 [4];
  time_point local_60;
  Timer timer;
  uint local_38;
  allocator<char> local_32;
  char local_31;
  
  local_31 = GTestIsInitialized();
  if (g_help_flag == '\0') {
    PostFlagParsingInit(this);
    WriteToShardStatusFileIfNeeded();
    pIVar1 = (this->internal_run_death_test_flag_)._M_t.
             super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
             ._M_t.
             super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
             .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>.
             _M_head_impl;
    bVar4 = ShouldShard("GTEST_TOTAL_SHARDS","GTEST_SHARD_INDEX",
                        pIVar1 != (InternalRunDeathTestFlag *)0x0);
    iVar5 = FilterTests(this,(uint)!bVar4);
    if (FLAGS_gtest_list_tests != '\x01') {
      iVar6 = 0;
      if (FLAGS_gtest_shuffle == '\x01') {
        iVar6 = GetRandomSeedFromFlag(FLAGS_gtest_random_seed);
      }
      this->random_seed_ = iVar6;
      pTVar2 = (this->listeners_).repeater_;
      TVar7 = GetTimeInMillis();
      this->start_timestamp_ = TVar7;
      (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[2])(pTVar2,this->parent_);
      local_38 = 1;
      if (pIVar1 == (InternalRunDeathTestFlag *)0x0) {
        local_38 = FLAGS_gtest_repeat;
      }
      timer.start_.__d.__r = (time_point)&this->environments_;
      uVar11 = 0;
      bVar13 = 0;
LAB_00117c71:
      if (uVar11 == local_38 && -1 < (int)local_38) {
        (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0x10])(pTVar2,this->parent_);
        if (local_31 == '\0') {
          ColoredPrintf(kRed,
                        "\nIMPORTANT NOTICE - DO NOT IGNORE:\nThis test program did NOT call testing::InitGoogleTest() before calling RUN_ALL_TESTS(). This is INVALID. Soon Google Test will start to enforce the valid usage. Please fix it ASAP, or IT WILL START TO FAIL.\n"
                       );
        }
        return (bool)(bVar13 ^ 1);
      }
      ClearNonAdHocTestResult(this);
      local_60.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      if (0 < iVar5) {
        if (FLAGS_gtest_shuffle == '\x01') {
          (this->random_).state_ = this->random_seed_;
          ShuffleTests(this);
        }
        (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[3])
                  (pTVar2,this->parent_,(ulong)uVar11);
        (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[4])(pTVar2,this->parent_);
        ForEach<std::vector<testing::Environment*,std::allocator<testing::Environment*>>,void(*)(testing::Environment*)>
                  ((vector<testing::Environment_*,_std::allocator<testing::Environment_*>_> *)
                   timer.start_.__d.__r,SetUpEnvironment);
        (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[5])(pTVar2,this->parent_);
        bVar4 = Test::IsSkipped();
        if (bVar4) {
          pUVar8 = GetUnitTestImpl();
          if (pUVar8->current_test_info_ == (TestInfo *)0x0) {
            if (pUVar8->current_test_suite_ == (TestSuite *)0x0) {
              this_00 = &pUVar8->ad_hoc_test_result_;
            }
            else {
              this_00 = &pUVar8->current_test_suite_->ad_hoc_test_result_;
            }
          }
          else {
            this_00 = &pUVar8->current_test_info_->result_;
          }
          for (iVar6 = 0;
              iVar6 < (int)(((long)(this_00->test_part_results_).
                                   super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this_00->test_part_results_).
                                  super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                  ._M_impl.super__Vector_impl_data._M_start) / 0x70);
              iVar6 = iVar6 + 1) {
            pTVar10 = TestResult::GetTestPartResult(this_00,iVar6);
            if (pTVar10->type_ == kSkip) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_80,(pTVar10->message_)._M_dataplus._M_p,&local_32);
              puts(local_80[0]);
              std::__cxx11::string::~string((string *)local_80);
            }
          }
          fflush(_stdout);
        }
        else {
          bVar4 = Test::HasFatalFailure();
          if (bVar4) {
            bVar4 = Test::HasFatalFailure();
            if (bVar4) {
              for (iVar6 = 0;
                  iVar6 < (int)((ulong)((long)(this->test_suites_).
                                              super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(this->test_suites_).
                                             super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
                  iVar6 = iVar6 + 1) {
                pTVar9 = GetMutableSuiteCase(this,iVar6);
                TestSuite::Skip(pTVar9);
              }
            }
          }
          else {
            iVar6 = 1;
            for (i = 0; i < (int)((ulong)((long)(this->test_suites_).
                                                super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(this->test_suites_).
                                               super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 3);
                i = i + 1) {
              pTVar9 = GetMutableSuiteCase(this,i);
              TestSuite::Run(pTVar9);
              if (FLAGS_gtest_fail_fast == '\x01') {
                pTVar9 = GetMutableSuiteCase(this,i);
                bVar4 = TestSuite::Failed(pTVar9);
                if (bVar4) goto LAB_00117e01;
              }
              iVar6 = iVar6 + 1;
            }
          }
        }
        goto LAB_00117e99;
      }
      (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[3])
                (pTVar2,this->parent_,(ulong)uVar11);
      goto LAB_00117ee4;
    }
    ListTestsMatchingFilter(this);
  }
  return true;
LAB_00117e01:
  for (; iVar6 < (int)((ulong)((long)(this->test_suites_).
                                     super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->test_suites_).
                                    super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3);
      iVar6 = iVar6 + 1) {
    pTVar9 = GetMutableSuiteCase(this,iVar6);
    TestSuite::Skip(pTVar9);
  }
LAB_00117e99:
  (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xd])(pTVar2,this->parent_);
  ppEVar3 = (this->environments_).
            super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  for (ppEVar12 = (this->environments_).
                  super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish; ppEVar12 != ppEVar3;
      ppEVar12 = ppEVar12 + -1) {
    (**(code **)(*(long *)ppEVar12[-1] + 0x18))();
  }
  (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xe])(pTVar2,this->parent_);
LAB_00117ee4:
  TVar7 = Timer::Elapsed((Timer *)&local_60);
  this->elapsed_time_ = TVar7;
  (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xf])
            (pTVar2,this->parent_,(ulong)uVar11);
  bVar4 = Passed(this);
  UnshuffleTests(this);
  if (FLAGS_gtest_shuffle == '\x01') {
    iVar6 = GetNextRandomSeed(this->random_seed_);
    this->random_seed_ = iVar6;
  }
  bVar13 = bVar13 | !bVar4;
  uVar11 = uVar11 + 1;
  goto LAB_00117c71;
}

Assistant:

bool UnitTestImpl::RunAllTests() {
  // True if and only if Google Test is initialized before RUN_ALL_TESTS() is
  // called.
  const bool gtest_is_initialized_before_run_all_tests = GTestIsInitialized();

  // Do not run any test if the --help flag was specified.
  if (g_help_flag)
    return true;

  // Repeats the call to the post-flag parsing initialization in case the
  // user didn't call InitGoogleTest.
  PostFlagParsingInit();

  // Even if sharding is not on, test runners may want to use the
  // GTEST_SHARD_STATUS_FILE to query whether the test supports the sharding
  // protocol.
  internal::WriteToShardStatusFileIfNeeded();

  // True if and only if we are in a subprocess for running a thread-safe-style
  // death test.
  bool in_subprocess_for_death_test = false;

#if GTEST_HAS_DEATH_TEST
  in_subprocess_for_death_test =
      (internal_run_death_test_flag_.get() != nullptr);
# if defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
  if (in_subprocess_for_death_test) {
    GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_();
  }
# endif  // defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
#endif  // GTEST_HAS_DEATH_TEST

  const bool should_shard = ShouldShard(kTestTotalShards, kTestShardIndex,
                                        in_subprocess_for_death_test);

  // Compares the full test names with the filter to decide which
  // tests to run.
  const bool has_tests_to_run = FilterTests(should_shard
                                              ? HONOR_SHARDING_PROTOCOL
                                              : IGNORE_SHARDING_PROTOCOL) > 0;

  // Lists the tests and exits if the --gtest_list_tests flag was specified.
  if (GTEST_FLAG(list_tests)) {
    // This must be called *after* FilterTests() has been called.
    ListTestsMatchingFilter();
    return true;
  }

  random_seed_ = GTEST_FLAG(shuffle) ?
      GetRandomSeedFromFlag(GTEST_FLAG(random_seed)) : 0;

  // True if and only if at least one test has failed.
  bool failed = false;

  TestEventListener* repeater = listeners()->repeater();

  start_timestamp_ = GetTimeInMillis();
  repeater->OnTestProgramStart(*parent_);

  // How many times to repeat the tests?  We don't want to repeat them
  // when we are inside the subprocess of a death test.
  const int repeat = in_subprocess_for_death_test ? 1 : GTEST_FLAG(repeat);
  // Repeats forever if the repeat count is negative.
  const bool gtest_repeat_forever = repeat < 0;
  for (int i = 0; gtest_repeat_forever || i != repeat; i++) {
    // We want to preserve failures generated by ad-hoc test
    // assertions executed before RUN_ALL_TESTS().
    ClearNonAdHocTestResult();

    Timer timer;

    // Shuffles test suites and tests if requested.
    if (has_tests_to_run && GTEST_FLAG(shuffle)) {
      random()->Reseed(static_cast<uint32_t>(random_seed_));
      // This should be done before calling OnTestIterationStart(),
      // such that a test event listener can see the actual test order
      // in the event.
      ShuffleTests();
    }

    // Tells the unit test event listeners that the tests are about to start.
    repeater->OnTestIterationStart(*parent_, i);

    // Runs each test suite if there is at least one test to run.
    if (has_tests_to_run) {
      // Sets up all environments beforehand.
      repeater->OnEnvironmentsSetUpStart(*parent_);
      ForEach(environments_, SetUpEnvironment);
      repeater->OnEnvironmentsSetUpEnd(*parent_);

      // Runs the tests only if there was no fatal failure or skip triggered
      // during global set-up.
      if (Test::IsSkipped()) {
        // Emit diagnostics when global set-up calls skip, as it will not be
        // emitted by default.
        TestResult& test_result =
            *internal::GetUnitTestImpl()->current_test_result();
        for (int j = 0; j < test_result.total_part_count(); ++j) {
          const TestPartResult& test_part_result =
              test_result.GetTestPartResult(j);
          if (test_part_result.type() == TestPartResult::kSkip) {
            const std::string& result = test_part_result.message();
            printf("%s\n", result.c_str());
          }
        }
        fflush(stdout);
      } else if (!Test::HasFatalFailure()) {
        for (int test_index = 0; test_index < total_test_suite_count();
             test_index++) {
          GetMutableSuiteCase(test_index)->Run();
          if (GTEST_FLAG(fail_fast) &&
              GetMutableSuiteCase(test_index)->Failed()) {
            for (int j = test_index + 1; j < total_test_suite_count(); j++) {
              GetMutableSuiteCase(j)->Skip();
            }
            break;
          }
        }
      } else if (Test::HasFatalFailure()) {
        // If there was a fatal failure during the global setup then we know we
        // aren't going to run any tests. Explicitly mark all of the tests as
        // skipped to make this obvious in the output.
        for (int test_index = 0; test_index < total_test_suite_count();
             test_index++) {
          GetMutableSuiteCase(test_index)->Skip();
        }
      }

      // Tears down all environments in reverse order afterwards.
      repeater->OnEnvironmentsTearDownStart(*parent_);
      std::for_each(environments_.rbegin(), environments_.rend(),
                    TearDownEnvironment);
      repeater->OnEnvironmentsTearDownEnd(*parent_);
    }

    elapsed_time_ = timer.Elapsed();

    // Tells the unit test event listener that the tests have just finished.
    repeater->OnTestIterationEnd(*parent_, i);

    // Gets the result and clears it.
    if (!Passed()) {
      failed = true;
    }

    // Restores the original test order after the iteration.  This
    // allows the user to quickly repro a failure that happens in the
    // N-th iteration without repeating the first (N - 1) iterations.
    // This is not enclosed in "if (GTEST_FLAG(shuffle)) { ... }", in
    // case the user somehow changes the value of the flag somewhere
    // (it's always safe to unshuffle the tests).
    UnshuffleTests();

    if (GTEST_FLAG(shuffle)) {
      // Picks a new random seed for each iteration.
      random_seed_ = GetNextRandomSeed(random_seed_);
    }
  }

  repeater->OnTestProgramEnd(*parent_);

  if (!gtest_is_initialized_before_run_all_tests) {
    ColoredPrintf(
        GTestColor::kRed,
        "\nIMPORTANT NOTICE - DO NOT IGNORE:\n"
        "This test program did NOT call " GTEST_INIT_GOOGLE_TEST_NAME_
        "() before calling RUN_ALL_TESTS(). This is INVALID. Soon " GTEST_NAME_
        " will start to enforce the valid usage. "
        "Please fix it ASAP, or IT WILL START TO FAIL.\n");  // NOLINT
#if GTEST_FOR_GOOGLE_
    ColoredPrintf(GTestColor::kRed,
                  "For more details, see http://wiki/Main/ValidGUnitMain.\n");
#endif  // GTEST_FOR_GOOGLE_
  }

  return !failed;
}